

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_for_each.cpp
# Opt level: O3

void range_based_for_each_index<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(uint w)

{
  int *piVar1;
  code *pcVar2;
  double dVar3;
  long *plVar4;
  pointer puVar5;
  pointer puVar6;
  char extraout_AL;
  bool bVar7;
  char extraout_AL_00;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  pointer *__ptr;
  default_delete<tf::Node> *this;
  ulong uVar12;
  Executor *this_00;
  char *pcVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar15;
  uint local_35c;
  in_place_type_t<tf::Node::Runtime> local_356;
  DefaultTaskParams local_355;
  uint local_354;
  Result local_350;
  ResultBuilder DOCTEST_RB;
  Expression_lhs<const_unsigned_long_&> local_2b8;
  int local_2a4;
  ulong local_2a0;
  size_t n;
  ulong local_290;
  ulong local_288;
  ulong local_280;
  ulong local_278;
  ulong local_270;
  TestCaseData *local_268;
  ulong local_260;
  unsigned_long *local_258;
  atomic<unsigned_long> counter;
  shared_ptr<tf::WorkerInterface> local_248;
  Taskflow taskflow;
  Executor executor;
  
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)w,&local_248);
  if (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  taskflow.super_FlowBuilder._graph = &taskflow._graph;
  taskflow._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  taskflow._name._M_dataplus._M_p = (pointer)&taskflow._name.field_2;
  taskflow._name._M_string_length = 0;
  taskflow._name.field_2._M_local_buf[0] = '\0';
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow._topologies,0);
  taskflow._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
  .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  counter.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  uVar10 = 10;
  iVar11 = -10;
  local_354 = 0x16;
  do {
    local_288 = (ulong)(iVar11 + 1);
    local_35c = 1;
    local_290 = uVar10;
    local_280 = uVar10;
    do {
      local_2a0 = uVar10;
      if ((int)local_280 != (int)uVar10) {
        local_278 = (ulong)(uint)((int)local_288 + (int)uVar10);
        local_268 = (TestCaseData *)((uVar10 << 0x20) + local_290);
        uVar10 = 1;
        uVar12 = 0xffffffff;
        do {
          n = (size_t)(((int)local_278 + (int)uVar12) / (int)uVar12);
          pcVar13 = (char *)0x0;
          local_270 = uVar10;
          local_260 = uVar12;
          local_258 = (unsigned_long *)n;
          do {
            puVar6 = taskflow._graph.
                     super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            puVar5 = taskflow._graph.
                     super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            this = (default_delete<tf::Node> *)
                   taskflow._graph.
                   super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            if (taskflow._graph.
                super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                .
                super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                taskflow._graph.
                super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                .
                super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              do {
                if (*(Node **)this != (Node *)0x0) {
                  std::default_delete<tf::Node>::operator()(this,*(Node **)this);
                }
                *(undefined8 *)this = 0;
                this = this + 8;
              } while (this != (default_delete<tf::Node> *)puVar6);
              taskflow._graph.
              super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              .
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = puVar5;
            }
            LOCK();
            counter.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
            UNLOCK();
            DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
            DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
            DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
            DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
            DOCTEST_RB.super_AssertData.m_test_case =
                 *(TestCaseData **)(doctest::detail::g_cs + 0x20);
            DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
            DOCTEST_RB.super_AssertData.m_file =
                 "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_for_each.cpp"
            ;
            DOCTEST_RB.super_AssertData.m_line = 0x27c;
            DOCTEST_RB.super_AssertData.m_expr = "range.size() == n";
            DOCTEST_RB.super_AssertData.m_failed = true;
            DOCTEST_RB.super_AssertData.m_threw = false;
            DOCTEST_RB.super_AssertData.m_threw_as = false;
            DOCTEST_RB.super_AssertData.m_exception_type = "";
            DOCTEST_RB.super_AssertData.m_exception_string = "";
            local_2b8.lhs = local_258;
            local_2b8.m_at = DT_REQUIRE;
            doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
                      (&local_350,(Expression_lhs<const_unsigned_long> *)&local_2b8,&n);
            doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_350.m_decomp);
            DOCTEST_RB.super_AssertData._40_2_ =
                 CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_350.m_passed) ^ 1;
            uVar14 = extraout_XMM0_Da;
            uVar15 = extraout_XMM0_Db;
            if ((local_350.m_decomp.field_0.buf[0x17] < '\0') &&
               (local_350.m_decomp.field_0.data.ptr != (char *)0x0)) {
              operator_delete__(local_350.m_decomp.field_0.data.ptr);
              uVar14 = extraout_XMM0_Da_00;
              uVar15 = extraout_XMM0_Db_00;
            }
            dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar15,uVar14))
            ;
            if (extraout_AL != '\0') {
              pcVar2 = (code *)swi(3);
              (*pcVar2)(SUB84(dVar3,0));
              return;
            }
            if ((DOCTEST_RB.super_AssertData.m_failed == true) &&
               (bVar7 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at), bVar7
               )) {
              doctest::detail::throwException();
            }
            if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
               ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                 DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0
               )) {
              operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                                 DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]
                                                ));
            }
            if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
               ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                 DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) !=
                (void *)0x0)) {
              operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0.
                                                 _1_7_,DOCTEST_RB.super_AssertData.m_exception.
                                                       field_0.buf[0]));
            }
            DOCTEST_RB.super_AssertData.m_test_case = local_268;
            DOCTEST_RB.super_AssertData.m_at = (Enum)local_260;
            local_350.m_passed = false;
            local_350._1_7_ = 0;
            local_2b8.lhs = (size_t *)0x0;
            local_2a4 = 0;
            DOCTEST_RB.super_AssertData.m_file = pcVar13;
            DOCTEST_RB.super_AssertData.m_expr = (char *)&counter;
            tf::Graph::
            _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Runtime>,tf::make_for_each_by_index_task<tf::IndexRange<int>,range_based_for_each_index<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(tf::IndexRange<int>)_1_,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(tf::IndexRange<int>,range_based_for_each_index<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(tf::IndexRange<int>)_1_,tf::GuidedPartitioner<tf::DefaultClosureWrapper>)::_lambda(tf::Runtime&)_1_>
                      (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                       &local_355,(void **)&local_350,&local_2b8.lhs,&local_2a4,&local_356,
                       (anon_class_40_3_229d3c0c *)&DOCTEST_RB);
            local_350.m_passed = true;
            local_350._1_7_ = 0;
            this_00 = &executor;
            tf::Executor::
            run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
                      ((Future<void> *)&DOCTEST_RB,this_00,&taskflow,
                       (anon_class_8_1_69701ed9 *)&local_350,(anon_class_1_0_00000001 *)&local_2b8);
            if (DOCTEST_RB.super_AssertData.m_test_case == (TestCaseData *)0x0) {
              std::__throw_future_error(3);
LAB_00149d4c:
              doctest::detail::throwException();
            }
            std::__future_base::_State_baseV2::wait
                      ((_State_baseV2 *)DOCTEST_RB.super_AssertData.m_test_case,this_00);
            plVar4 = (long *)CONCAT44(DOCTEST_RB.super_AssertData._28_4_,
                                      DOCTEST_RB.super_AssertData.m_line);
            if (plVar4 != (long *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                piVar1 = (int *)((long)plVar4 + 0xc);
                iVar11 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
              }
              else {
                iVar11 = *(int *)((long)plVar4 + 0xc);
                *(int *)((long)plVar4 + 0xc) = iVar11 + -1;
              }
              if (iVar11 == 1) {
                (**(code **)(*plVar4 + 0x18))();
              }
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(DOCTEST_RB.super_AssertData._12_4_,DOCTEST_RB.super_AssertData.m_at) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(DOCTEST_RB.super_AssertData._12_4_,
                                  DOCTEST_RB.super_AssertData.m_at));
            }
            DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
            DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
            DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
            DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
            DOCTEST_RB.super_AssertData.m_test_case =
                 *(TestCaseData **)(doctest::detail::g_cs + 0x20);
            DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
            DOCTEST_RB.super_AssertData.m_file =
                 "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_for_each.cpp"
            ;
            DOCTEST_RB.super_AssertData.m_line = 0x287;
            DOCTEST_RB.super_AssertData.m_expr = "n == counter";
            DOCTEST_RB.super_AssertData.m_failed = true;
            DOCTEST_RB.super_AssertData.m_threw = false;
            DOCTEST_RB.super_AssertData.m_threw_as = false;
            DOCTEST_RB.super_AssertData.m_exception_type = "";
            DOCTEST_RB.super_AssertData.m_exception_string = "";
            local_2b8.lhs = &n;
            local_2b8.m_at = DT_REQUIRE;
            doctest::detail::Expression_lhs<const_unsigned_long_&>::
            operator==<std::atomic<unsigned_long>,_nullptr>(&local_350,&local_2b8,&counter);
            doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_350.m_decomp);
            DOCTEST_RB.super_AssertData._40_2_ =
                 CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_350.m_passed) ^ 1;
            uVar14 = extraout_XMM0_Da_01;
            uVar15 = extraout_XMM0_Db_01;
            if ((local_350.m_decomp.field_0.buf[0x17] < '\0') &&
               (local_350.m_decomp.field_0.data.ptr != (char *)0x0)) {
              operator_delete__(local_350.m_decomp.field_0.data.ptr);
              uVar14 = extraout_XMM0_Da_02;
              uVar15 = extraout_XMM0_Db_02;
            }
            dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar15,uVar14))
            ;
            if (extraout_AL_00 != '\0') {
              pcVar2 = (code *)swi(3);
              (*pcVar2)(SUB84(dVar3,0));
              return;
            }
            if ((DOCTEST_RB.super_AssertData.m_failed == true) &&
               (bVar7 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at), bVar7
               )) goto LAB_00149d4c;
            if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
               ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                 DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0
               )) {
              operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                                 DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]
                                                ));
            }
            if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
               ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                 DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) !=
                (void *)0x0)) {
              operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0.
                                                 _1_7_,DOCTEST_RB.super_AssertData.m_exception.
                                                       field_0.buf[0]));
            }
            pcVar13 = pcVar13 + 1;
          } while (pcVar13 != (char *)0xa);
          uVar8 = (uint)local_270 + 1;
          uVar12 = (ulong)~(uint)local_270;
          uVar10 = (ulong)uVar8;
        } while (uVar8 != local_35c);
      }
      uVar10 = (ulong)((int)local_2a0 - 1);
      local_35c = local_35c + 1;
    } while (local_35c != local_354);
    iVar9 = (int)local_280;
    iVar11 = 1 - iVar9;
    local_354 = local_354 - 1;
    uVar10 = (ulong)(iVar9 - 1);
    if (iVar9 < -9) {
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
  } while( true );
}

Assistant:

void range_based_for_each_index(unsigned w) {    
  tf::Executor executor(w);
  tf::Taskflow taskflow;
  std::atomic<size_t> counter {0};

  for(int beg=10; beg>=-10; --beg) {
    for(int end=beg; end>=-10; --end) {
      for(int s=1; s<=beg-end; ++s) {

        size_t n = tf::distance(beg, end, -s);

        for(size_t c=0; c<10; c++) {
          taskflow.clear();
          counter = 0;

          tf::IndexRange range(beg, end, -s);
          REQUIRE(range.size() == n);

          taskflow.for_each_by_index(range, [&] (tf::IndexRange<int> lrange) {
            size_t l = 0;
            for(auto j=lrange.begin(); j>lrange.end(); j+=lrange.step_size()) {
              l++;
            }
            REQUIRE(lrange.size() == l);
            counter.fetch_add(l, std::memory_order_relaxed);
          }, P(c));
          executor.run(taskflow).wait();
          REQUIRE(n == counter);
        }
      }
    }
  }
}